

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O1

void __thiscall bsplib::exception::exception(exception *this,exception *e)

{
  long *local_30 [2];
  long local_20 [2];
  
  *(undefined ***)this = &PTR__exception_00115d20;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&this->m_stream,(string *)local_30,_S_out);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  (this->m_buf)._M_dataplus._M_p = (pointer)&(this->m_buf).field_2;
  (this->m_buf)._M_string_length = 0;
  (this->m_buf).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

exception( const exception & e )
      : m_stream( e.m_stream.str() )
      , m_buf( )
    {}